

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::
GenerateConditionMaybeWithProbability_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint32_t mask,
          optional<float> probability,bool use_cached_has_bits,optional<int> has_array_index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint in_register_00000014;
  uint7 in_register_00000081;
  string condition;
  uint local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  undefined8 local_60;
  string local_58;
  FormatSpec<unsigned_int> local_38;
  
  local_60 = CONCAT44(in_register_00000014,mask);
  local_8c = (uint)this;
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_68 = CONCAT71(in_register_00000081,use_cached_has_bits);
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (probability.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float>._M_payload == (_Storage<float,_true>)0x0) {
    if ((in_register_00000081 & 0x1000000) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                 ,0x83,"has_array_index.has_value()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_38.super_type.spec_.data_ = "(this_._impl_._has_bits_[%d] & 0x%08xu) != 0";
    local_38.super_type.spec_.size_ = 0x2c;
    absl::lts_20250127::StrFormat<int,_unsigned_int>
              (&local_58,(FormatSpec<int,_unsigned_int> *)&local_38,(int *)&local_68,&local_8c);
  }
  else {
    local_38.super_type.spec_.data_ = "(cached_has_bits & 0x%08xu) != 0";
    local_38.super_type.spec_.size_ = 0x20;
    absl::lts_20250127::StrFormat<unsigned_int>(&local_58,&local_38,&local_8c);
  }
  std::__cxx11::string::operator=((string *)&local_88,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((in_register_00000014 & 1) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58._M_dataplus._M_p = "PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)";
    local_58._M_string_length = 0x2f;
    absl::lts_20250127::
    StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
              (__return_storage_ptr__,
               (FormatSpec<std::__cxx11::basic_string<char>,_float> *)&local_58,&local_88,
               (float *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateConditionMaybeWithProbability(
    uint32_t mask, absl::optional<float> probability, bool use_cached_has_bits,
    absl::optional<int> has_array_index) {
  std::string condition;
  if (use_cached_has_bits) {
    condition = absl::StrFormat("(cached_has_bits & 0x%08xu) != 0", mask);
  } else {
    // We only use has_array_index when use_cached_has_bits is false, make sure
    // we pas a valid index when we need it.
    ABSL_DCHECK(has_array_index.has_value());
    condition = absl::StrFormat("(this_._impl_._has_bits_[%d] & 0x%08xu) != 0",
                                *has_array_index, mask);
  }
  if (probability.has_value()) {
    return absl::StrFormat("PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)",
                           condition, *probability);
  }
  return condition;
}